

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

TEXTURE_FORMAT Diligent::TypelessFormatToUnorm(TEXTURE_FORMAT Fmt)

{
  TEXTURE_FORMAT local_a;
  TEXTURE_FORMAT Fmt_local;
  
  switch(Fmt) {
  case TEX_FORMAT_RGBA16_TYPELESS:
    local_a = TEX_FORMAT_RGBA16_UNORM;
    break;
  default:
    local_a = Fmt;
    break;
  case TEX_FORMAT_RGBA8_TYPELESS:
    local_a = TEX_FORMAT_RGBA8_UNORM;
    break;
  case TEX_FORMAT_RG16_TYPELESS:
    local_a = TEX_FORMAT_RG16_UNORM;
    break;
  case TEX_FORMAT_RG8_TYPELESS:
    local_a = TEX_FORMAT_RG8_UNORM;
    break;
  case TEX_FORMAT_R16_TYPELESS:
    local_a = TEX_FORMAT_R16_UNORM;
    break;
  case TEX_FORMAT_R8_TYPELESS:
    local_a = TEX_FORMAT_R8_UNORM;
    break;
  case TEX_FORMAT_BC1_TYPELESS:
    local_a = TEX_FORMAT_BC1_UNORM;
    break;
  case TEX_FORMAT_BC2_TYPELESS:
    local_a = TEX_FORMAT_BC2_UNORM;
    break;
  case TEX_FORMAT_BC3_TYPELESS:
    local_a = TEX_FORMAT_BC3_UNORM;
    break;
  case TEX_FORMAT_BC4_TYPELESS:
    local_a = TEX_FORMAT_BC4_UNORM;
    break;
  case TEX_FORMAT_BC5_TYPELESS:
    local_a = TEX_FORMAT_BC5_UNORM;
    break;
  case TEX_FORMAT_BGRA8_TYPELESS:
    local_a = TEX_FORMAT_BGRA8_UNORM;
    break;
  case TEX_FORMAT_BGRX8_TYPELESS:
    local_a = TEX_FORMAT_BGRX8_UNORM;
  }
  return local_a;
}

Assistant:

TEXTURE_FORMAT TypelessFormatToUnorm(TEXTURE_FORMAT Fmt)
{
    static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please update the switch below to handle the new texture format, if needed");
    switch (Fmt)
    {
        case TEX_FORMAT_R8_TYPELESS:
            return TEX_FORMAT_R8_UNORM;

        case TEX_FORMAT_RG8_TYPELESS:
            return TEX_FORMAT_RG8_UNORM;

        case TEX_FORMAT_RGBA8_TYPELESS:
            return TEX_FORMAT_RGBA8_UNORM;

        case TEX_FORMAT_BGRA8_TYPELESS:
            return TEX_FORMAT_BGRA8_UNORM;

        case TEX_FORMAT_BGRX8_TYPELESS:
            return TEX_FORMAT_BGRX8_UNORM;

        case TEX_FORMAT_R16_TYPELESS:
            return TEX_FORMAT_R16_UNORM;

        case TEX_FORMAT_RG16_TYPELESS:
            return TEX_FORMAT_RG16_UNORM;

        case TEX_FORMAT_RGBA16_TYPELESS:
            return TEX_FORMAT_RGBA16_UNORM;

        case TEX_FORMAT_BC1_TYPELESS:
            return TEX_FORMAT_BC1_UNORM;

        case TEX_FORMAT_BC2_TYPELESS:
            return TEX_FORMAT_BC2_UNORM;

        case TEX_FORMAT_BC3_TYPELESS:
            return TEX_FORMAT_BC3_UNORM;

        case TEX_FORMAT_BC4_TYPELESS:
            return TEX_FORMAT_BC4_UNORM;

        case TEX_FORMAT_BC5_TYPELESS:
            return TEX_FORMAT_BC5_UNORM;

        default:
            return Fmt;
    }
}